

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::RenderTests::~RenderTests(RenderTests *this)

{
  ~RenderTests(this);
  operator_delete(this,0xc88);
  return;
}

Assistant:

RenderTests				(EglTestContext& eglTestCtx, const string& name, const string& desc)
												: ImageTests			(eglTestCtx, name, desc) {}